

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network4.c
# Opt level: O0

int net_tcp4_accept_socket(int s,uchar *ip,unsigned_short *port)

{
  uint uVar1;
  uchar *local_40;
  uchar *ptr;
  int fd;
  socklen_t len;
  sockaddr_in sa;
  unsigned_short *port_local;
  uchar *ip_local;
  int s_local;
  
  ptr._4_4_ = 0x10;
  sa.sin_zero = (uchar  [8])port;
  ptr._0_4_ = accept(s,(sockaddr *)&fd,(socklen_t *)((long)&ptr + 4));
  if ((int)ptr == -1) {
    ip_local._4_4_ = -1;
  }
  else {
    *(socklen_t *)ip = len;
    local_40 = (uchar *)((long)&fd + 2);
    uVar1 = uint16_unpack__(&local_40);
    *(short *)sa.sin_zero = (short)uVar1;
    ip_local._4_4_ = (int)ptr;
  }
  return ip_local._4_4_;
}

Assistant:

int net_tcp4_accept_socket(int s,
                           unsigned char ip[4],
                           unsigned short *port) {
  struct sockaddr_in sa;
  socklen_t len = sizeof(sa);
  int fd;

  fd = accept(s, (struct sockaddr *)&sa, &len);
  if (fd == -1)
    return -1;

  memcpy(ip, (unsigned char *)&sa.sin_addr, 4);
  unsigned char *ptr = (unsigned char *)&sa.sin_port;
  *port = UINT16_UNPACK(ptr);

  return fd;
}